

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int begin_get_offered_capabilities(BEGIN_HANDLE begin,AMQP_VALUE *offered_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *offered_capabilities_single_value;
  uint local_3c;
  char *local_38;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    return 0xbfc;
  }
  iVar1 = amqpvalue_get_composite_item_count(begin->composite_value,&local_3c);
  if (iVar1 != 0) {
    return 0xc04;
  }
  if (local_3c < 6) {
    return 0xc0a;
  }
  pAVar4 = amqpvalue_get_composite_item_in_place(begin->composite_value,5);
  if (pAVar4 == (AMQP_VALUE)0x0) {
    return 0xc12;
  }
  AVar2 = amqpvalue_get_type(pAVar4);
  if (AVar2 == AMQP_TYPE_NULL) {
    return 0xc12;
  }
  AVar2 = amqpvalue_get_type(pAVar4);
  if (AVar2 == AMQP_TYPE_ARRAY) {
    local_38 = (char *)0x0;
    AVar2 = amqpvalue_get_type(pAVar4);
    bVar5 = true;
    if (AVar2 != AMQP_TYPE_ARRAY) {
      return 0xc25;
    }
  }
  else {
    iVar1 = amqpvalue_get_symbol(pAVar4,&local_38);
    bVar5 = iVar1 != 0;
    AVar2 = amqpvalue_get_type(pAVar4);
    if (AVar2 != AMQP_TYPE_ARRAY) {
      if (iVar1 != 0) {
        return 0xc25;
      }
      goto LAB_0014ef3e;
    }
  }
  iVar1 = amqpvalue_get_array(pAVar4,offered_capabilities_value);
  if ((bool)(iVar1 != 0 & bVar5)) {
    return 0xc25;
  }
LAB_0014ef3e:
  AVar2 = amqpvalue_get_type(pAVar4);
  iVar1 = 0;
  if (AVar2 != AMQP_TYPE_ARRAY) {
    pAVar4 = amqpvalue_create_array();
    *offered_capabilities_value = pAVar4;
    if (pAVar4 == (AMQP_VALUE)0x0) {
      iVar1 = 0xc2e;
    }
    else {
      pAVar4 = amqpvalue_create_symbol(local_38);
      if (pAVar4 == (AMQP_VALUE)0x0) {
        iVar1 = 0xc35;
      }
      else {
        iVar3 = amqpvalue_add_array_item(*offered_capabilities_value,pAVar4);
        iVar1 = 0xc3b;
        if (iVar3 == 0) {
          iVar3 = amqpvalue_set_composite_item(begin->composite_value,5,*offered_capabilities_value)
          ;
          iVar1 = 0xc41;
          if (iVar3 == 0) {
            iVar1 = 0;
          }
        }
        amqpvalue_destroy(pAVar4);
      }
      amqpvalue_destroy(*offered_capabilities_value);
    }
  }
  return iVar1;
}

Assistant:

int begin_get_offered_capabilities(BEGIN_HANDLE begin, AMQP_VALUE* offered_capabilities_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        if (amqpvalue_get_composite_item_count(begin_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 5)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(begin_instance->composite_value, 5);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* offered_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &offered_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&offered_capabilities_single_value, 0, sizeof(offered_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, offered_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *offered_capabilities_value = amqpvalue_create_array();
                            if (*offered_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(offered_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*offered_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(begin_instance->composite_value, 5, *offered_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*offered_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}